

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

void http_finish(http_s *r)

{
  if ((r != (http_s *)0x0) && ((r->private_data).vtbl != (void *)0x0)) {
    add_content_length(r,0);
    add_date(r);
    (**(code **)((long)(r->private_data).vtbl + 0x18))(r);
    return;
  }
  return;
}

Assistant:

void http_finish(http_s *r) {
  if (!r || !r->private_data.vtbl) {
    return;
  }
  add_content_length(r, 0);
  add_date(r);
  ((http_vtable_s *)r->private_data.vtbl)->http_finish(r);
}